

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

int __thiscall ModelWriter::estimate_memory_footprint(ModelWriter *this)

{
  FILE *__stream;
  bool bVar1;
  reference ppLVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  long in_RDI;
  Mat m_1;
  Blob *blob;
  size_t i_1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> outputs;
  Mat m;
  int dims;
  int c;
  int h;
  int w;
  Input *input;
  Layer *layer;
  size_t i;
  Extractor ex;
  MemoryFootprintAllocator allocator;
  size_t blob_count;
  size_t layer_count;
  char *in_stack_fffffffffffffd78;
  FILE *in_stack_fffffffffffffd80;
  Net *in_stack_fffffffffffffd88;
  MemoryFootprintAllocator *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Mat *in_stack_fffffffffffffda0;
  FILE *in_stack_fffffffffffffda8;
  int iVar5;
  Mat *in_stack_fffffffffffffdb0;
  undefined1 local_220 [8];
  int *local_218;
  pthread_mutex_t local_210;
  int local_1e8;
  _Rb_tree_node_base local_1e0;
  Mat local_1b0;
  undefined4 local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  value_type local_150;
  value_type local_148;
  size_type local_140;
  Extractor local_128;
  Allocator local_118;
  int local_10c;
  _Base_ptr local_b0;
  size_type local_a8;
  int local_94;
  Mat *local_90;
  MemoryFootprintAllocator *local_88;
  Mat *local_80;
  Net *in_stack_ffffffffffffff90;
  Mat *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  Extractor *in_stack_ffffffffffffffa8;
  
  if ((*(byte *)(in_RDI + 0x60) & 1) == 0) {
    local_a8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                         (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58)
                         );
    local_b0 = (_Base_ptr)
               std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::size
                         (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50));
    MemoryFootprintAllocator::MemoryFootprintAllocator(in_stack_fffffffffffffd90);
    ncnn::Net::create_extractor(in_stack_fffffffffffffd88);
    ncnn::Extractor::set_light_mode(&local_128,true);
    ncnn::Extractor::set_blob_allocator(&local_128,&local_118);
    ncnn::Extractor::set_workspace_allocator(&local_128,&local_118);
    for (local_140 = 0; local_140 < local_a8; local_140 = local_140 + 1) {
      ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_140);
      local_148 = *ppLVar2;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((!bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78),
         __stream = _stderr, !bVar1)) {
        local_150 = local_148;
        local_154 = *(int *)&local_148[1]._vptr_Layer;
        local_158 = *(int *)((long)&local_148[1]._vptr_Layer + 4);
        local_15c._0_1_ = local_148[1].support_bf16_storage;
        local_15c._1_1_ = local_148[1].support_fp16_storage;
        local_15c._2_1_ = local_148[1].support_int8_storage;
        local_15c._3_1_ = local_148[1].support_image_storage;
        local_160 = 0;
        if ((local_154 != 0) && ((local_158 == 0 && (local_15c == 0)))) {
          local_160 = 1;
        }
        if (((local_154 != 0) && (local_158 != 0)) && (local_15c == 0)) {
          local_160 = 2;
        }
        if (((local_154 != 0) && (local_158 != 0)) && (local_15c != 0)) {
          local_160 = 3;
        }
        if (local_160 == 0) {
          uVar3 = std::__cxx11::string::c_str();
          fprintf(__stream,"Input layer %s without shape info, estimate_memory_footprint skipped\n",
                  uVar3);
          local_94 = -1;
          local_164 = 1;
          goto LAB_001671a7;
        }
        local_90 = &local_1b0;
        local_1b0.data = (void *)0x0;
        local_1b0.refcount = (int *)0x0;
        local_1b0.elemsize = 0;
        local_1b0.elempack = 0;
        local_1b0.allocator = (Allocator *)0x0;
        local_1b0.dims = 0;
        local_1b0.w = 0;
        local_1b0.h = 0;
        local_1b0.d = 0;
        local_1b0.c = 0;
        local_1b0.cstep = 0;
        if (local_160 == 1) {
          ncnn::Mat::create(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                            (size_t)in_stack_fffffffffffffd90,(Allocator *)in_stack_fffffffffffffd88
                           );
        }
        if (local_160 == 2) {
          ncnn::Mat::create(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                            in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90,
                            (Allocator *)in_stack_fffffffffffffd88);
        }
        if (local_160 == 3) {
          ncnn::Mat::create(in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                            (int)in_stack_fffffffffffffda8,
                            (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                            CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                            &in_stack_fffffffffffffd90->super_Allocator);
        }
        iVar5 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
        std::vector<int,_std::allocator<int>_>::operator[](&local_148->tops,0);
        ncnn::Extractor::input
                  ((Extractor *)in_stack_fffffffffffffdb0,iVar5,in_stack_fffffffffffffda0);
        in_stack_fffffffffffffda0 = *(Mat **)(in_RDI + 0x50);
        in_stack_fffffffffffffda8 = _stderr;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_148->tops,0);
        std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                  ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffffda0,
                   (long)*pvVar4);
        uVar3 = std::__cxx11::string::c_str();
        fprintf(in_stack_fffffffffffffda8,"input = %s\n",uVar3);
        in_stack_fffffffffffffdb0 = &local_1b0;
        local_80 = in_stack_fffffffffffffdb0;
        if (local_1b0.refcount != (int *)0x0) {
          LOCK();
          iVar5 = *local_1b0.refcount;
          *local_1b0.refcount = *local_1b0.refcount + -1;
          UNLOCK();
          if (iVar5 == 1) {
            if (local_1b0.allocator == (Allocator *)0x0) {
              if (local_1b0.data != (void *)0x0) {
                free(local_1b0.data);
              }
            }
            else {
              (*(local_1b0.allocator)->_vptr_Allocator[3])(local_1b0.allocator,local_1b0.data);
            }
          }
        }
        in_stack_fffffffffffffdb0->data = (void *)0x0;
        in_stack_fffffffffffffdb0->elemsize = 0;
        in_stack_fffffffffffffdb0->elempack = 0;
        in_stack_fffffffffffffdb0->dims = 0;
        in_stack_fffffffffffffdb0->w = 0;
        in_stack_fffffffffffffdb0->h = 0;
        in_stack_fffffffffffffdb0->d = 0;
        in_stack_fffffffffffffdb0->c = 0;
        in_stack_fffffffffffffdb0->cstep = 0;
        in_stack_fffffffffffffdb0->refcount = (int *)0x0;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x166d50);
    for (local_1e0._M_left = (_Base_ptr)0x0; local_1e0._M_left < local_b0;
        local_1e0._M_left = (_Base_ptr)((long)&(local_1e0._M_left)->_M_color + 1)) {
      local_1e0._M_parent =
           (_Base_ptr)
           std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                     (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                      (size_type)local_1e0._M_left);
      if ((*(int *)&(((NetPrivate *)local_1e0._M_parent)->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start != -1) &&
         (*(int *)((long)&(((NetPrivate *)local_1e0._M_parent)->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start + 4) == -1)) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                   (long)*(int *)&(((NetPrivate *)local_1e0._M_parent)->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        if (!bVar1) {
          in_stack_fffffffffffffd90 = (MemoryFootprintAllocator *)local_220;
          local_220 = (undefined1  [8])0x0;
          local_218 = (int *)0x0;
          local_210.__align = 0;
          local_210.__data.__owner = 0;
          local_210._16_8_ = (long *)0x0;
          local_210._24_4_ = 0;
          local_210._28_4_ = 0;
          local_210._32_4_ = 0;
          local_210._36_4_ = 0;
          local_1e8 = 0;
          local_1e0._M_color = _S_red;
          local_1e0._4_4_ = 0;
          local_88 = in_stack_fffffffffffffd90;
          ncnn::Extractor::extract
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                    ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffd90,
                     (value_type *)in_stack_fffffffffffffd88);
          in_stack_fffffffffffffd80 = _stderr;
          uVar3 = std::__cxx11::string::c_str();
          fprintf(in_stack_fffffffffffffd80,"extract = %s\n",uVar3);
          in_stack_fffffffffffffd88 = (Net *)local_220;
          in_stack_ffffffffffffff90 = in_stack_fffffffffffffd88;
          if (local_218 != (int *)0x0) {
            LOCK();
            iVar5 = *local_218;
            *local_218 = *local_218 + -1;
            UNLOCK();
            if (iVar5 == 1) {
              if ((long *)local_210._16_8_ == (long *)0x0) {
                if (local_220 != (undefined1  [8])0x0) {
                  free((void *)local_220);
                }
              }
              else {
                (**(code **)(*local_210._16_8_ + 0x18))(local_210._16_8_,local_220);
              }
            }
          }
          in_stack_fffffffffffffd88->_vptr_Net = (_func_int **)0x0;
          (in_stack_fffffffffffffd88->opt).blob_allocator = (Allocator *)0x0;
          *(undefined4 *)&(in_stack_fffffffffffffd88->opt).workspace_allocator = 0;
          (in_stack_fffffffffffffd88->opt).use_bf16_storage = false;
          (in_stack_fffffffffffffd88->opt).use_fp16_packed = false;
          (in_stack_fffffffffffffd88->opt).use_fp16_storage = false;
          (in_stack_fffffffffffffd88->opt).use_fp16_arithmetic = false;
          (in_stack_fffffffffffffd88->opt).use_int8_packed = false;
          (in_stack_fffffffffffffd88->opt).use_int8_storage = false;
          (in_stack_fffffffffffffd88->opt).use_int8_arithmetic = false;
          (in_stack_fffffffffffffd88->opt).use_packing_layout = false;
          (in_stack_fffffffffffffd88->opt).use_shader_pack8 = false;
          (in_stack_fffffffffffffd88->opt).use_subgroup_basic = false;
          (in_stack_fffffffffffffd88->opt).use_subgroup_vote = false;
          (in_stack_fffffffffffffd88->opt).use_subgroup_ballot = false;
          (in_stack_fffffffffffffd88->opt).use_subgroup_shuffle = false;
          (in_stack_fffffffffffffd88->opt).use_image_storage = false;
          (in_stack_fffffffffffffd88->opt).use_tensor_storage = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_0 = false;
          (in_stack_fffffffffffffd88->opt).flush_denormals = 0;
          (in_stack_fffffffffffffd88->opt).use_winograd43_convolution = false;
          (in_stack_fffffffffffffd88->opt).use_winograd63_convolution = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_6 = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_7 = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_8 = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_9 = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_10 = false;
          (in_stack_fffffffffffffd88->opt).use_reserved_11 = false;
          (in_stack_fffffffffffffd88->opt).lightmode = false;
          *(undefined3 *)&(in_stack_fffffffffffffd88->opt).field_0x1 = 0;
          (in_stack_fffffffffffffd88->opt).num_threads = 0;
        }
      }
    }
    fprintf(_stderr,"estimated memory footprint = %.2f KB = %.2f MB\n",
            (double)((float)local_10c / 1024.0),(double)(((float)local_10c / 1024.0) / 1024.0));
    local_94 = 0;
    local_164 = 1;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffd90);
LAB_001671a7:
    ncnn::Extractor::~Extractor((Extractor *)in_stack_fffffffffffffd80);
    MemoryFootprintAllocator::~MemoryFootprintAllocator
              ((MemoryFootprintAllocator *)in_stack_fffffffffffffd80);
  }
  else {
    fprintf(_stderr,"model has custom layer, estimate_memory_footprint skipped\n");
    local_94 = -1;
  }
  return local_94;
}

Assistant:

int ModelWriter::estimate_memory_footprint()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, estimate_memory_footprint skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    MemoryFootprintAllocator allocator;

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    ex.set_blob_allocator(&allocator);
    ex.set_workspace_allocator(&allocator);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, estimate_memory_footprint skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w, 4u, &allocator);
        if (dims == 2) m.create(w, h, 4u, &allocator);
        if (dims == 3) m.create(w, h, c, 4u, &allocator);

        ex.input(layer->tops[0], m);

        fprintf(stderr, "input = %s\n", blobs[layer->tops[0]].name.c_str());
    }

    // find output blobs and do inference
    std::vector<ncnn::Mat> outputs;
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        if (blob.producer == -1 || blob.consumer != -1)
            continue;

        if (layers[blob.producer]->type == "ncnnfused")
            continue;

        // treat blob without any consumers as output
        ncnn::Mat m;
        ex.extract(int(i), m);
        outputs.push_back(m);

        fprintf(stderr, "extract = %s\n", blob.name.c_str());
    }

    fprintf(stderr, "estimated memory footprint = %.2f KB = %.2f MB\n", allocator.memory_footprint / 1024.f, allocator.memory_footprint / 1024.f / 1024.f);

    return 0;
}